

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool IsUnixSocketPath(string *name)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __x._M_str = ADDR_PREFIX_UNIX_abi_cxx11_._M_dataplus._M_p;
  __x._M_len = ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(name,__x);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&str,name,ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length,0xffffffffffffffff);
    bVar2 = str._M_string_length + 1 < 0x6d;
    std::__cxx11::string::~string((string *)&str);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsUnixSocketPath(const std::string& name)
{
#ifdef HAVE_SOCKADDR_UN
    if (!name.starts_with(ADDR_PREFIX_UNIX)) return false;

    // Split off "unix:" prefix
    std::string str{name.substr(ADDR_PREFIX_UNIX.length())};

    // Path size limit is platform-dependent
    // see https://manpages.ubuntu.com/manpages/xenial/en/man7/unix.7.html
    if (str.size() + 1 > sizeof(((sockaddr_un*)nullptr)->sun_path)) return false;

    return true;
#else
    return false;
#endif
}